

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O0

void __thiscall xray_re::xr_custom_object::save_v12(xr_custom_object *this,xr_ini_writer *w)

{
  xr_ini_writer *this_00;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  string local_38 [32];
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_custom_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_ini_writer::write(w,0x2e2eb2,(void *)(ulong)this->m_class_id,in_RCX);
  xr_ini_writer::write(local_18,0x2e2eb8,(void *)(ulong)this->m_flags,in_RCX);
  xr_ini_writer::write(local_18,0x2e40af,(void *)0x0,in_RCX);
  this_00 = local_18;
  std::__cxx11::string::string(local_38,(string *)&this->m_name);
  xr_ini_writer::write(this_00,0x2e1396,local_38,0);
  std::__cxx11::string::~string(local_38);
  xr_ini_writer::write(local_18,0x2e38d6,__buf,(ulong)(uint)(this->m_position).field_0.field_0.z);
  xr_ini_writer::write(local_18,0x2e2ec1,__buf_00,(ulong)(uint)(this->m_rotation).field_0.field_0.z)
  ;
  xr_ini_writer::write(local_18,0x2e2eca,__buf_01,(ulong)(uint)(this->m_scale).field_0.field_0.z);
  return;
}

Assistant:

void xr_custom_object::save_v12(xr_ini_writer* w) const
{
	w->write("clsid", m_class_id);
	w->write("co_flags", m_flags);
	w->write("flags", 0);
	w->write("name", m_name, false);
	w->write("position", m_position);
	w->write("rotation", m_rotation);
	w->write("scale", m_scale);
}